

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_mesh_shading.cpp
# Opt level: O0

spv_result_t spvtools::val::MeshShadingPass(ValidationState_t *_,Instruction *inst)

{
  Instruction *pIVar1;
  bool bVar2;
  uint id;
  Op OVar3;
  StorageClass SVar4;
  uint32_t uVar5;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this;
  size_type sVar6;
  Function *pFVar7;
  DiagnosticStream *pDVar8;
  DiagnosticStream local_d80;
  uint32_t local_ba4;
  undefined1 local_ba0 [4];
  uint32_t primitive_count;
  uint32_t local_9c8;
  anon_class_1_0_00000001 local_9c1;
  uint32_t vertex_count;
  DiagnosticStream local_9a0;
  DiagnosticStream local_7c8;
  Instruction *local_5f0;
  Instruction *payload;
  uint32_t local_40c;
  undefined1 local_408 [4];
  uint32_t group_count_z;
  uint32_t local_22c;
  undefined1 local_228 [4];
  uint32_t group_count_y;
  uint32_t local_50;
  anon_class_1_0_00000001 local_49;
  uint32_t group_count_x;
  Op local_24;
  Instruction *pIStack_20;
  Op opcode;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  local_24 = Instruction::opcode(inst);
  pIVar1 = inst_local;
  if (local_24 == OpEmitMeshTasksEXT) {
    pFVar7 = Instruction::function(pIStack_20);
    uVar5 = Function::id(pFVar7);
    pFVar7 = ValidationState_t::function((ValidationState_t *)pIVar1,uVar5);
    std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>::
    function<spvtools::val::MeshShadingPass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__0,void>
              ((function<bool(spv::ExecutionModel,std::__cxx11::string*)> *)&group_count_x,&local_49
              );
    Function::RegisterExecutionModelLimitation
              (pFVar7,(function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                       *)&group_count_x);
    std::
    function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
    ::~function((function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                 *)&group_count_x);
    local_50 = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,pIStack_20,0);
    bVar2 = ValidationState_t::IsUnsignedIntScalarType((ValidationState_t *)inst_local,local_50);
    if ((!bVar2) ||
       (uVar5 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_50),
       uVar5 != 0x20)) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_228,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_DATA,pIStack_20);
      pDVar8 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_228,
                          (char (*) [51])"Group Count X must be a 32-bit unsigned int scalar");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_228);
      return __local._4_4_;
    }
    local_22c = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,pIStack_20,1);
    bVar2 = ValidationState_t::IsUnsignedIntScalarType((ValidationState_t *)inst_local,local_22c);
    if ((!bVar2) ||
       (uVar5 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_22c),
       uVar5 != 0x20)) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_408,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_DATA,pIStack_20);
      pDVar8 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_408,
                          (char (*) [51])"Group Count Y must be a 32-bit unsigned int scalar");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_408);
      return __local._4_4_;
    }
    local_40c = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,pIStack_20,2);
    bVar2 = ValidationState_t::IsUnsignedIntScalarType((ValidationState_t *)inst_local,local_40c);
    if ((!bVar2) ||
       (uVar5 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_40c),
       uVar5 != 0x20)) {
      ValidationState_t::diag
                ((DiagnosticStream *)&payload,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA
                 ,pIStack_20);
      pDVar8 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)&payload,
                          (char (*) [51])"Group Count Z must be a 32-bit unsigned int scalar");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&payload);
      return __local._4_4_;
    }
    this = Instruction::operands(pIStack_20);
    sVar6 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(this);
    pIVar1 = inst_local;
    if (sVar6 == 4) {
      id = Instruction::GetOperandAs<unsigned_int>(pIStack_20,3);
      local_5f0 = ValidationState_t::FindDef((ValidationState_t *)pIVar1,id);
      OVar3 = Instruction::opcode(local_5f0);
      if (OVar3 != OpVariable) {
        ValidationState_t::diag
                  (&local_7c8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,pIStack_20);
        pDVar8 = DiagnosticStream::operator<<
                           (&local_7c8,(char (*) [43])"Payload must be the result of a OpVariable");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
        DiagnosticStream::~DiagnosticStream(&local_7c8);
        return __local._4_4_;
      }
      SVar4 = Instruction::GetOperandAs<spv::StorageClass>(local_5f0,2);
      if (SVar4 != StorageClassTaskPayloadWorkgroupEXT) {
        ValidationState_t::diag
                  (&local_9a0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,pIStack_20);
        pDVar8 = DiagnosticStream::operator<<
                           (&local_9a0,
                            (char (*) [72])
                            "Payload OpVariable must have a storage class of TaskPayloadWorkgroupEXT"
                           );
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
        DiagnosticStream::~DiagnosticStream(&local_9a0);
        return __local._4_4_;
      }
    }
  }
  else if (local_24 == OpSetMeshOutputsEXT) {
    pFVar7 = Instruction::function(pIStack_20);
    uVar5 = Function::id(pFVar7);
    pFVar7 = ValidationState_t::function((ValidationState_t *)pIVar1,uVar5);
    std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>::
    function<spvtools::val::MeshShadingPass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__1,void>
              ((function<bool(spv::ExecutionModel,std::__cxx11::string*)> *)&vertex_count,&local_9c1
              );
    Function::RegisterExecutionModelLimitation
              (pFVar7,(function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                       *)&vertex_count);
    std::
    function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
    ::~function((function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                 *)&vertex_count);
    local_9c8 = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,pIStack_20,0);
    bVar2 = ValidationState_t::IsUnsignedIntScalarType((ValidationState_t *)inst_local,local_9c8);
    if ((!bVar2) ||
       (uVar5 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_9c8),
       uVar5 != 0x20)) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_ba0,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_DATA,pIStack_20);
      pDVar8 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_ba0,
                          (char (*) [50])"Vertex Count must be a 32-bit unsigned int scalar");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_ba0);
      return __local._4_4_;
    }
    local_ba4 = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,pIStack_20,1);
    bVar2 = ValidationState_t::IsUnsignedIntScalarType((ValidationState_t *)inst_local,local_ba4);
    if ((!bVar2) ||
       (uVar5 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_ba4),
       uVar5 != 0x20)) {
      ValidationState_t::diag
                (&local_d80,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,pIStack_20);
      pDVar8 = DiagnosticStream::operator<<
                         (&local_d80,
                          (char (*) [53])"Primitive Count must be a 32-bit unsigned int scalar");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream(&local_d80);
      return __local._4_4_;
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t MeshShadingPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();
  switch (opcode) {
    case spv::Op::OpEmitMeshTasksEXT: {
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              [](spv::ExecutionModel model, std::string* message) {
                if (model != spv::ExecutionModel::TaskEXT) {
                  if (message) {
                    *message =
                        "OpEmitMeshTasksEXT requires TaskEXT execution model";
                  }
                  return false;
                }
                return true;
              });

      const uint32_t group_count_x = _.GetOperandTypeId(inst, 0);
      if (!_.IsUnsignedIntScalarType(group_count_x) ||
          _.GetBitWidth(group_count_x) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Group Count X must be a 32-bit unsigned int scalar";
      }

      const uint32_t group_count_y = _.GetOperandTypeId(inst, 1);
      if (!_.IsUnsignedIntScalarType(group_count_y) ||
          _.GetBitWidth(group_count_y) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Group Count Y must be a 32-bit unsigned int scalar";
      }

      const uint32_t group_count_z = _.GetOperandTypeId(inst, 2);
      if (!_.IsUnsignedIntScalarType(group_count_z) ||
          _.GetBitWidth(group_count_z) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Group Count Z must be a 32-bit unsigned int scalar";
      }

      if (inst->operands().size() == 4) {
        const auto payload = _.FindDef(inst->GetOperandAs<uint32_t>(3));
        if (payload->opcode() != spv::Op::OpVariable) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Payload must be the result of a OpVariable";
        }
        if (payload->GetOperandAs<spv::StorageClass>(2) !=
            spv::StorageClass::TaskPayloadWorkgroupEXT) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Payload OpVariable must have a storage class of "
                    "TaskPayloadWorkgroupEXT";
        }
      }
      break;
    }

    case spv::Op::OpSetMeshOutputsEXT: {
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              [](spv::ExecutionModel model, std::string* message) {
                if (model != spv::ExecutionModel::MeshEXT) {
                  if (message) {
                    *message =
                        "OpSetMeshOutputsEXT requires MeshEXT execution model";
                  }
                  return false;
                }
                return true;
              });

      const uint32_t vertex_count = _.GetOperandTypeId(inst, 0);
      if (!_.IsUnsignedIntScalarType(vertex_count) ||
          _.GetBitWidth(vertex_count) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Vertex Count must be a 32-bit unsigned int scalar";
      }

      const uint32_t primitive_count = _.GetOperandTypeId(inst, 1);
      if (!_.IsUnsignedIntScalarType(primitive_count) ||
          _.GetBitWidth(primitive_count) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Primitive Count must be a 32-bit unsigned int scalar";
      }

      break;
    }

    case spv::Op::OpWritePackedPrimitiveIndices4x8NV: {
      // No validation rules (for the moment).
      break;
    }

    default:
      break;
  }

  return SPV_SUCCESS;
}